

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faxman.h
# Opt level: O3

size_t ClownLZSS::Internal::Faxman::GetMatchCost(size_t distance,size_t length,void *user)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = 0x12;
  if (length < 3) {
    sVar2 = 0;
  }
  sVar1 = 0xc;
  if (3 < length - 2) {
    sVar1 = sVar2;
  }
  if (0x100 < distance) {
    sVar1 = sVar2;
  }
  return sVar1;
}

Assistant:

inline std::size_t GetMatchCost(const std::size_t distance, const std::size_t length, [[maybe_unused]] void* const user)
			{
				if (length >= 2 && length <= 5 && distance <= 0x100)
					return 2 + 8 + 2;
				else if (length >= 3)
					return 2 + 16; // Descriptor bit, offset/length bits.
				else
					return 0;
			}